

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_trompeloeil.hpp
# Opt level: O0

void trompeloeil::reporter<trompeloeil::specialized>::sendOk
               (char *trompeloeil_mock_calls_done_correctly)

{
  int local_d8 [5];
  Decomposer local_c1;
  char **local_c0;
  BinaryExpr<const_char_*const_&,_const_int_&> local_b8;
  StringRef local_88;
  SourceLineInfo local_78;
  StringRef local_68;
  undefined1 local_58 [8];
  AssertionHandler catchAssertionHandler;
  char *trompeloeil_mock_calls_done_correctly_local;
  
  catchAssertionHandler.m_resultCapture = (IResultCapture *)trompeloeil_mock_calls_done_correctly;
  local_68 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_78,
             "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Catch2/catch_trompeloeil.hpp"
             ,0x35);
  Catch::StringRef::StringRef(&local_88,"trompeloeil_mock_calls_done_correctly != 0");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_58,&local_68,&local_78,local_88,Normal);
  local_c0 = (char **)Catch::Decomposer::operator<=
                                (&local_c1,(char **)&catchAssertionHandler.m_resultCapture);
  local_d8[0] = 0;
  Catch::ExprLhs<char_const*const&>::operator!=
            (&local_b8,(ExprLhs<char_const*const&> *)&local_c0,local_d8);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_58,&local_b8.super_ITransientExpression);
  Catch::BinaryExpr<const_char_*const_&,_const_int_&>::~BinaryExpr(&local_b8);
  Catch::AssertionHandler::complete((AssertionHandler *)local_58);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_58);
  return;
}

Assistant:

inline void reporter<specialized>::sendOk(
    const char* trompeloeil_mock_calls_done_correctly)
  {      
      REQUIRE(trompeloeil_mock_calls_done_correctly != 0);
  }